

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBAnalyzerResults.cpp
# Opt level: O2

void __thiscall
USBAnalyzerResults::GenerateExportFileBytes
          (USBAnalyzerResults *this,char *file,DisplayBase display_base)

{
  undefined8 i;
  undefined2 uVar1;
  char cVar2;
  uint uVar3;
  ulonglong uVar4;
  ostream *poVar5;
  ulonglong uVar6;
  ulonglong uVar7;
  Frame f;
  char local_2e8;
  string local_2e0;
  undefined2 local_2c0;
  char time_str [128];
  ofstream file_stream;
  
  std::ofstream::ofstream(&file_stream,file,_S_out);
  uVar4 = Analyzer::GetTriggerSample();
  uVar3 = Analyzer::GetSampleRate();
  poVar5 = std::operator<<((ostream *)&file_stream,"Time [s],Byte");
  std::endl<char,std::char_traits<char>>(poVar5);
  Frame::Frame(&f);
  time_str[0] = '\0';
  uVar6 = AnalyzerResults::GetNumFrames();
  for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
    AnalyzerResults::GetFrame((ulonglong)&local_2e0);
    uVar1 = local_2c0;
    i = local_2e0.field_2._M_allocated_capacity;
    _f = local_2e0._M_dataplus._M_p;
    Frame::~Frame((Frame *)&local_2e0);
    cVar2 = AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,uVar7);
    if (cVar2 != '\0') goto LAB_001320f3;
    local_2e8 = (char)uVar1;
    if (local_2e8 == '\v') {
      AnalyzerHelpers::GetTimeString((ulonglong)_f,uVar4,uVar3,time_str,0x80);
      poVar5 = std::operator<<((ostream *)&file_stream,time_str);
      poVar5 = std::operator<<(poVar5,",");
      int2str_sal_abi_cxx11_(&local_2e0,i,display_base,8);
      poVar5 = std::operator<<(poVar5,(string *)&local_2e0);
      std::endl<char,std::char_traits<char>>(poVar5);
      std::__cxx11::string::~string((string *)&local_2e0);
    }
  }
  AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,uVar6);
LAB_001320f3:
  Frame::~Frame(&f);
  std::ofstream::~ofstream(&file_stream);
  return;
}

Assistant:

void USBAnalyzerResults::GenerateExportFileBytes( const char* file, DisplayBase display_base )
{
    std::ofstream file_stream( file, std::ios::out );

    U64 trigger_sample = mAnalyzer->GetTriggerSample();
    U32 sample_rate = mAnalyzer->GetSampleRate();

    // header
    file_stream << "Time [s],Byte" << std::endl;

    Frame f;
    char time_str[ 128 ];
    time_str[ 0 ] = '\0';
    const U64 num_frames = GetNumFrames();
    for( U64 fcnt = 0; fcnt < num_frames; fcnt++ )
    {
        // get the frame
        f = GetFrame( fcnt );

        if( UpdateExportProgressAndCheckForCancel( fcnt, num_frames ) )
            return;

        // start of a new packet?
        if( f.mType == FT_Byte )
        {
            // make the time string
            AnalyzerHelpers::GetTimeString( f.mStartingSampleInclusive, trigger_sample, sample_rate, time_str, sizeof( time_str ) );

            // output byte and timestamp
            file_stream << time_str << "," << int2str_sal( f.mData1, display_base, 8 ) << std::endl;
        }
    }

    // end
    UpdateExportProgressAndCheckForCancel( num_frames, num_frames );
}